

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O0

void __thiscall lzham::prefix_coding::decoder_tables::clear(decoder_tables *this)

{
  lzham_malloc_context in_RDI;
  uint *in_stack_ffffffffffffffe8;
  
  if (*(long *)((long)in_RDI + 0xb0) != 0) {
    lzham_delete_array<unsigned_int>(in_RDI,in_stack_ffffffffffffffe8);
    *(undefined8 *)((long)in_RDI + 0xb0) = 0;
    *(undefined4 *)((long)in_RDI + 0xac) = 0;
  }
  if (*(long *)((long)in_RDI + 0xc0) != 0) {
    lzham_delete_array<unsigned_short>(in_RDI,(unsigned_short *)in_stack_ffffffffffffffe8);
    *(undefined8 *)((long)in_RDI + 0xc0) = 0;
    *(undefined4 *)((long)in_RDI + 0xb8) = 0;
  }
  return;
}

Assistant:

inline void clear()
         {
            if (m_lookup)
            {
               lzham_delete_array(m_malloc_context, m_lookup);
               m_lookup = 0;
               m_cur_lookup_size = 0;
            }

            if (m_sorted_symbol_order)
            {
               lzham_delete_array(m_malloc_context, m_sorted_symbol_order);
               m_sorted_symbol_order = NULL;
               m_cur_sorted_symbol_order_size = 0;
            }
         }